

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_build_name_lists_multiple(list_t *anms)

{
  int iVar1;
  anm_entry_t *local_80;
  char *local_78;
  anm_entry_t *local_70;
  anm_archive_t *local_68;
  undefined8 *local_60;
  list_node_t *node_3;
  list_node_t *node_2;
  list_node_t *node_1;
  list_node_t *node;
  anm_entry_t **nextloc;
  anm_entry_t *tmp;
  anm_entry_t *entry;
  char *name;
  anm_archive_t *anm2;
  anm_archive_t *anm;
  list_t *anms_local;
  
  node_1 = anms->head;
  anm = (anm_archive_t *)anms;
  do {
    if (node_1 == (list_node_t *)0x0) {
      local_68 = (anm_archive_t *)0x0;
    }
    else {
      local_68 = (anm_archive_t *)node_1->data;
    }
    anm2 = local_68;
    if (node_1 == (list_node_t *)0x0) {
      return;
    }
    node_2 = (local_68->names).head;
    while( true ) {
      if (node_2 == (list_node_t *)0x0) {
        local_70 = (anm_entry_t *)0x0;
      }
      else {
        local_70 = (anm_entry_t *)node_2->data;
      }
      entry = local_70;
      if (node_2 == (list_node_t *)0x0) break;
      node = (list_node_t *)&nextloc;
      node_3 = (list_node_t *)anm->map;
      while( true ) {
        if (node_3 == (list_node_t *)0x0) {
          local_78 = (char *)0x0;
        }
        else {
          local_78 = (char *)node_3->data;
        }
        name = local_78;
        if (node_3 == (list_node_t *)0x0) break;
        local_60 = *(undefined8 **)(local_78 + 0x20);
        while( true ) {
          if (local_60 == (undefined8 *)0x0) {
            local_80 = (anm_entry_t *)0x0;
          }
          else {
            local_80 = (anm_entry_t *)local_60[2];
          }
          tmp = local_80;
          if (local_60 == (undefined8 *)0x0) break;
          if (((anm_entry_t *)local_80->name == entry) ||
             (iVar1 = strcmp((char *)entry,local_80->name), iVar1 == 0)) {
            entry = (anm_entry_t *)tmp->name;
            if (tmp->next_by_name != (anm_entry_t *)0x0) goto LAB_0011066b;
            node->next = (list_node_t *)tmp;
            node = (list_node_t *)&tmp->next_by_name;
          }
          local_60 = (undefined8 *)*local_60;
        }
        node_3 = node_3->next;
      }
LAB_0011066b:
      node_2 = node_2->next;
    }
    node_1 = node_1->next;
  } while( true );
}

Assistant:

static void
anm_build_name_lists_multiple(
    list_t *anms)
{
    const anm_archive_t *anm, *anm2;
    const char *name;
    anm_entry_t *entry, *tmp, **nextloc;
    list_for_each(anms, anm)
        list_for_each(&anm->names, name) {
            nextloc = &tmp;
            list_for_each(anms, anm2)
                list_for_each(&anm2->entries, entry)
                    if (entry->name == name || !strcmp(name, entry->name)) {
                        name = entry->name;
                        if (entry->next_by_name)
                            goto next_name; /* we already did this name */
                        *nextloc = entry;
                        nextloc = &entry->next_by_name;
                    }
            next_name:;
        }
}